

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

uint16 crnlib::etc1_block::pack_delta3(int r,int g,int b)

{
  int b_local;
  int g_local;
  int r_local;
  
  r_local = r;
  if (r < 0) {
    r_local = r + 8;
  }
  g_local = g;
  if (g < 0) {
    g_local = g + 8;
  }
  b_local = b;
  if (b < 0) {
    b_local = b + 8;
  }
  return (ushort)b_local | (ushort)(g_local << 3) | (ushort)(r_local << 6);
}

Assistant:

uint16 etc1_block::pack_delta3(int r, int g, int b) {
  CRNLIB_ASSERT((r >= cETC1ColorDeltaMin) && (r <= cETC1ColorDeltaMax));
  CRNLIB_ASSERT((g >= cETC1ColorDeltaMin) && (g <= cETC1ColorDeltaMax));
  CRNLIB_ASSERT((b >= cETC1ColorDeltaMin) && (b <= cETC1ColorDeltaMax));
  if (r < 0)
    r += 8;
  if (g < 0)
    g += 8;
  if (b < 0)
    b += 8;
  return static_cast<uint16>(b | (g << 3) | (r << 6));
}